

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_lab(MIR_context_t ctx,writer_func_t writer,MIR_label_t lab)

{
  uint64_t u;
  size_t sVar1;
  uint64_t lab_num;
  size_t len;
  size_t nb;
  MIR_label_t lab_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if (writer == (writer_func_t)0x0) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    u = lab->ops[0].u.u;
    len = uint_length(u);
    if (4 < len) {
      __assert_fail("nb <= 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x12db,"size_t write_lab(MIR_context_t, writer_func_t, MIR_label_t)");
    }
    if (len == 0) {
      len = 1;
    }
    put_byte(ctx,writer,(int)len + 0x1f);
    sVar1 = put_uint(ctx,writer,u,(int)len);
    ctx_local = (MIR_context_t)(sVar1 + 1);
    ctx->io_ctx->output_labs_len = (long)&ctx_local->gen_ctx + ctx->io_ctx->output_labs_len;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t write_lab (MIR_context_t ctx, writer_func_t writer, MIR_label_t lab) {
  size_t nb, len;
  uint64_t lab_num;

  if (writer == NULL) return 0;
  lab_num = lab->ops[0].u.u;
  nb = uint_length (lab_num);
  mir_assert (nb <= 4);
  if (nb == 0) nb = 1;
  put_byte (ctx, writer, TAG_LAB1 + (int) nb - 1);
  len = put_uint (ctx, writer, lab_num, (int) nb) + 1;
  output_labs_len += len;
  return len;
}